

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self,ptls_t *tls,int is_encrypt,ptls_buffer_t *dst,
                     ptls_iovec_t src)

{
  uint8_t *puVar1;
  size_t sVar2;
  int iVar3;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var4;
  ptls_context_t *ppVar5;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *__size;
  int ret;
  st_util_session_cache_t *self;
  ptls_buffer_t *dst_local;
  int is_encrypt_local;
  ptls_t *tls_local;
  ptls_encrypt_ticket_t *_self_local;
  ptls_iovec_t src_local;
  
  __size = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *)
           src.len;
  if (is_encrypt == 0) {
    if (__size != (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t
                   *)0x20) {
      return 0x205;
    }
    iVar3 = memcmp(_self + 1,src.base,0x20);
    if (iVar3 != 0) {
      return 0x205;
    }
    iVar3 = ptls_buffer_reserve(dst,(size_t)_self[6].cb);
    if (iVar3 != 0) {
      return iVar3;
    }
    memcpy(dst->base + dst->off,_self[5].cb,(size_t)_self[6].cb);
    dst->off = (size_t)(_self[6].cb + dst->off);
  }
  else {
    free(_self[5].cb);
    p_Var4 = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *
             )malloc((size_t)__size);
    _self[5].cb = p_Var4;
    if (p_Var4 == (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t
                   *)0x0) {
      return 0x201;
    }
    ppVar5 = ptls_get_context(tls);
    (*ppVar5->random_bytes)(_self + 1,0x20);
    memcpy(_self[5].cb,src.base,(size_t)__size);
    _self[6].cb = __size;
    iVar3 = ptls_buffer_reserve(dst,0x20);
    if (iVar3 != 0) {
      return iVar3;
    }
    puVar1 = dst->base;
    sVar2 = dst->off;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + sVar2) = _self[1].cb;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + sVar2 + 8) = _self[2].cb;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + sVar2 + 0x10) = _self[3].cb;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + sVar2 + 0x18) = _self[4].cb;
    dst->off = dst->off + 0x20;
  }
  return 0;
}

Assistant:

static int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self, ptls_t *tls, int is_encrypt, ptls_buffer_t *dst, ptls_iovec_t src)
{
    struct st_util_session_cache_t *self = (void *)_self;
    int ret;

    if (is_encrypt) {

        /* replace the cached entry along with a newly generated session id */
        free(self->data.base);
        if ((self->data.base = malloc(src.len)) == NULL)
            return PTLS_ERROR_NO_MEMORY;

        ptls_get_context(tls)->random_bytes(self->id, sizeof(self->id));
        memcpy(self->data.base, src.base, src.len);
        self->data.len = src.len;

        /* store the session id in buffer */
        if ((ret = ptls_buffer_reserve(dst, sizeof(self->id))) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->id, sizeof(self->id));
        dst->off += sizeof(self->id);

    } else {

        /* check if session id is the one stored in cache */
        if (src.len != sizeof(self->id))
            return PTLS_ERROR_SESSION_NOT_FOUND;
        if (memcmp(self->id, src.base, sizeof(self->id)) != 0)
            return PTLS_ERROR_SESSION_NOT_FOUND;

        /* return the cached value */
        if ((ret = ptls_buffer_reserve(dst, self->data.len)) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->data.base, self->data.len);
        dst->off += self->data.len;
    }

    return 0;
}